

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss_pyramid.h
# Opt level: O2

void gimage::createGaussPyramid<float,float>
               (vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
                *p,Image<float,_gimage::PixelTraits<float>_> *image)

{
  Image<float,_gimage::PixelTraits<float>_> *this;
  pointer pIVar1;
  int iVar2;
  long lVar3;
  int i;
  long lVar4;
  __type _Var5;
  double dVar6;
  
  lVar4 = image->width;
  if (image->height < image->width) {
    lVar4 = image->height;
  }
  iVar2 = 0;
  if (1 < (int)lVar4) {
    _Var5 = std::log<int>((int)lVar4);
    dVar6 = floor(_Var5 / 0.6931471805599453);
    iVar2 = (int)dVar6;
  }
  std::
  vector<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
  ::resize(p,(long)iVar2);
  if (iVar2 != 0) {
    this = (p->
           super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if (this != image) {
      Image<float,_gimage::PixelTraits<float>_>::setImage(this,image);
    }
    lVar3 = 0;
    for (lVar4 = 1; lVar4 < iVar2; lVar4 = lVar4 + 1) {
      pIVar1 = (p->
               super__Vector_base<gimage::Image<float,_gimage::PixelTraits<float>_>,_std::allocator<gimage::Image<float,_gimage::PixelTraits<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      reduceGauss<float,float>
                ((Image<float,_gimage::PixelTraits<float>_> *)((long)&pIVar1[1].depth + lVar3),
                 (Image<float,_gimage::PixelTraits<float>_> *)((long)&pIVar1->depth + lVar3));
      lVar3 = lVar3 + 0x38;
    }
  }
  return;
}

Assistant:

void createGaussPyramid(std::vector<Image<T> > &p, const Image<S> &image)
{
  // determine number of levels

  int n=std::min(image.getWidth(), image.getHeight());

  if (n >= 2)
  {
    n=static_cast<int>(std::floor(std::log(n)/std::log(2)));
  }
  else
  {
    n=0;
  }

  p.resize(n);

  if (n == 0) return; // input image is too small

  // populate highest level with given image if not already done

  if (&(p[0]) != &image)
  {
    p[0].setImage(image);
  }

  // smooth and downsample image for all other levels

  for (int i=1; i<n; i++)
  {
    reduceGauss(p[i], p[i-1]);
  }
}